

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O1

void __thiscall calculator::SyntaxError::~SyntaxError(SyntaxError *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__SyntaxError_00118718;
  pcVar2 = (this->error_msg)._M_dataplus._M_p;
  paVar1 = &(this->error_msg).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::exception::~exception(&this->super_exception);
  operator_delete(this,0x28);
  return;
}

Assistant:

SyntaxError(const std::string& error = "") {
        error_msg = "Error: " + error;
    }